

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_stream_init(cubeb_conflict1 *ctx,cubeb_stream_conflict1 **stream,char *stream_name,
                    cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                    cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                    uint latency_frames,cubeb_data_callback_conflict1 data_callback,
                    cubeb_state_callback_conflict1 state_callback,void *user_ptr)

{
  cubeb_devid in_RCX;
  undefined8 in_RDX;
  cubeb_conflict1 *unaff_RBX;
  char *in_RSI;
  cubeb_stream_conflict1 **in_RDI;
  cubeb_stream_params *in_R8;
  long in_stack_00000008;
  uint in_stack_00000010;
  cubeb_data_callback_conflict1 in_stack_00000018;
  cubeb_state_callback_conflict1 in_stack_00000020;
  cubeb_stream_conflict1 *outstm;
  cubeb_stream_conflict1 *instm;
  int result;
  int local_3c;
  snd_pcm_stream_t stream_type;
  
  stream_type = (snd_pcm_stream_t)((ulong)in_RDX >> 0x20);
  local_3c = 0;
  if (in_R8 != (cubeb_stream_params *)0x0) {
    local_3c = alsa_stream_init_single
                         (unaff_RBX,in_RDI,in_RSI,stream_type,in_RCX,in_R8,in_stack_00000010,
                          in_stack_00000018,in_stack_00000020,outstm);
  }
  if ((local_3c == 0) && (in_stack_00000008 != 0)) {
    local_3c = alsa_stream_init_single
                         (unaff_RBX,in_RDI,in_RSI,stream_type,in_RCX,in_R8,in_stack_00000010,
                          in_stack_00000018,in_stack_00000020,outstm);
  }
  if (((local_3c == 0) && (in_R8 != (cubeb_stream_params *)0x0)) && (in_stack_00000008 != 0)) {
    uRam0000000000000110 = 0;
  }
  in_RSI[0] = '\0';
  in_RSI[1] = '\0';
  in_RSI[2] = '\0';
  in_RSI[3] = '\0';
  in_RSI[4] = '\0';
  in_RSI[5] = '\0';
  in_RSI[6] = '\0';
  in_RSI[7] = '\0';
  return local_3c;
}

Assistant:

static int
alsa_stream_init(cubeb * ctx, cubeb_stream ** stream, char const * stream_name,
                 cubeb_devid input_device,
                 cubeb_stream_params * input_stream_params,
                 cubeb_devid output_device,
                 cubeb_stream_params * output_stream_params,
                 unsigned int latency_frames,
                 cubeb_data_callback data_callback, cubeb_state_callback state_callback,
                 void * user_ptr)
{
  int result = CUBEB_OK;
  cubeb_stream * instm = NULL, * outstm = NULL;

  if (result == CUBEB_OK && input_stream_params) {
    result = alsa_stream_init_single(ctx, &instm, stream_name, SND_PCM_STREAM_CAPTURE,
                                     input_device, input_stream_params, latency_frames,
                                     data_callback, state_callback, user_ptr);
  }

  if (result == CUBEB_OK && output_stream_params) {
    result = alsa_stream_init_single(ctx, &outstm, stream_name, SND_PCM_STREAM_PLAYBACK,
                                     output_device, output_stream_params, latency_frames,
                                     data_callback, state_callback, user_ptr);
  }

  if (result == CUBEB_OK && input_stream_params && output_stream_params) {
    instm->other_stream = outstm;
    outstm->other_stream = instm;
  }

  if (result != CUBEB_OK && instm) {
    alsa_stream_destroy(instm);
  }

  *stream = outstm ? outstm : instm;

  return result;
}